

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError StopStream(PaStream *s)

{
  PaError PVar1;
  PaStream *s_local;
  
  PVar1 = RealStop((PaAlsaStream *)s,0);
  return PVar1;
}

Assistant:

static PaError StopStream( PaStream *s )
{
    PaError result = paNoError;
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) stream;

    /* IMPLEMENT ME, see portaudio.h for required behavior */

    return result;
}